

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QDateTimeEdit::mousePressEvent(QDateTimeEdit *this,QMouseEvent *event)

{
  uint *puVar1;
  QDateTimeEditPrivate *this_00;
  QWidget *this_01;
  bool bVar2;
  long in_FS_OFFSET;
  double dVar3;
  undefined1 auVar4 [16];
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDateTimeEditPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  if ((this_00->calendarPopup == true) &&
     (((this_00->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
       super_QFlagsStorage<QDateTimeEdit::Section>.i & 0x3f00) != 0)) {
    auVar4 = QEventPoint::position();
    dVar3 = (double)((ulong)auVar4._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar4._0_8_;
    bVar2 = 2147483647.0 < dVar3;
    if (dVar3 <= -2147483648.0) {
      dVar3 = -2147483648.0;
    }
    local_28.xp.m_i =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar3);
    dVar3 = (double)((ulong)auVar4._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar4._8_8_;
    bVar2 = 2147483647.0 < dVar3;
    if (dVar3 <= -2147483648.0) {
      dVar3 = -2147483648.0;
    }
    local_28.yp.m_i =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar3);
    QAbstractSpinBoxPrivate::updateHoverControl(&this_00->super_QAbstractSpinBoxPrivate,&local_28);
    if ((this_00->super_QAbstractSpinBoxPrivate).hoverControl == SC_ComboBoxArrow) {
      event[0xc] = (QMouseEvent)0x1;
      if (((this_00->super_QAbstractSpinBoxPrivate).field_0x3d0 & 2) == 0) {
        if (this_00->arrowState != State_Sunken) {
          this_01 = *(QWidget **)
                     &(this_00->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.field_0x8;
          this_00->arrowState = State_Sunken;
          puVar1 = &(this_00->super_QAbstractSpinBoxPrivate).buttonState;
          *(byte *)puVar1 = (byte)*puVar1 | 2;
          QWidget::update(this_01);
        }
        QDateTimeEditPrivate::initCalendarPopup(this_00,(QCalendarWidget *)0x0);
        QDateTimeEditPrivate::positionCalendarPopup(this_00);
        QWidget::show(&this_00->monthCalendar->super_QWidget);
      }
    }
    else {
      QAbstractSpinBox::mousePressEvent((QAbstractSpinBox *)this,event);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QAbstractSpinBox::mousePressEvent((QAbstractSpinBox *)this,event);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::mousePressEvent(QMouseEvent *event)
{
    Q_D(QDateTimeEdit);
    if (!d->calendarPopupEnabled()) {
        QAbstractSpinBox::mousePressEvent(event);
        return;
    }
    d->updateHoverControl(event->position().toPoint());
    if (d->hoverControl == QStyle::SC_ComboBoxArrow) {
        event->accept();
        if (d->readOnly) {
            return;
        }
        d->updateArrow(QStyle::State_Sunken);
        d->initCalendarPopup();
        d->positionCalendarPopup();
        //Show the calendar
        d->monthCalendar->show();
    } else {
        QAbstractSpinBox::mousePressEvent(event);
    }
}